

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O2

void __thiscall soul::HEARTGenerator::visit(HEARTGenerator *this,Connection *conn)

{
  Connection *pCVar1;
  optional<unsigned_long> oVar2;
  optional<long> oVar3;
  undefined1 local_60 [32];
  pool_ptr<soul::AST::Expression> local_40;
  undefined1 local_38 [16];
  
  pCVar1 = Module::allocate<soul::heart::Connection,soul::CodeLocation&>
                     (this->module,&(conn->super_ASTObject).context.location);
  local_60._0_8_ = pCVar1;
  std::
  vector<soul::pool_ref<soul::heart::Connection>,std::allocator<soul::pool_ref<soul::heart::Connection>>>
  ::emplace_back<soul::pool_ref<soul::heart::Connection>>
            ((vector<soul::pool_ref<soul::heart::Connection>,std::allocator<soul::pool_ref<soul::heart::Connection>>>
              *)&this->module->connections,(pool_ref<soul::heart::Connection> *)local_60);
  AST::Connection::getSourceProcessor((Connection *)(local_38 + 8));
  getOrAddProcessorInstance
            ((HEARTGenerator *)local_60,(pool_ptr<soul::AST::ProcessorInstance> *)this);
  (pCVar1->source).processor.object = (ProcessorInstance *)local_60._0_8_;
  AST::Connection::getDestProcessor((Connection *)local_38);
  getOrAddProcessorInstance
            ((HEARTGenerator *)local_60,(pool_ptr<soul::AST::ProcessorInstance> *)this);
  (pCVar1->dest).processor.object = (ProcessorInstance *)local_60._0_8_;
  AST::Connection::getSourceEndpointName_abi_cxx11_((string *)local_60,conn);
  std::__cxx11::string::operator=((string *)&(pCVar1->source).endpointName,(string *)local_60);
  std::__cxx11::string::~string((string *)local_60);
  oVar2 = AST::Connection::getSourceEndpointIndex(conn);
  (pCVar1->source).endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value =
       oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  (pCVar1->source).endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged =
       oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  AST::Connection::getDestEndpointName_abi_cxx11_((string *)local_60,conn);
  std::__cxx11::string::operator=((string *)&(pCVar1->dest).endpointName,(string *)local_60);
  std::__cxx11::string::~string((string *)local_60);
  oVar2 = AST::Connection::getDestEndpointIndex(conn);
  (pCVar1->dest).endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value =
       oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  (pCVar1->dest).endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged =
       oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  pCVar1->interpolationType = conn->interpolationType;
  local_40.object = (conn->delayLength).object;
  oVar3 = getDelayLength(&local_40);
  (pCVar1->delayLength).super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload._M_value =
       oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
       _M_payload;
  (pCVar1->delayLength).super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged =
       oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
       _M_engaged;
  return;
}

Assistant:

void visit (AST::Connection& conn) override
    {
        auto& c = module.allocate<heart::Connection> (conn.context.location);
        module.connections.push_back (c);

        c.source.processor      = getOrAddProcessorInstance (conn.getSourceProcessor());
        c.dest.processor        = getOrAddProcessorInstance (conn.getDestProcessor());
        c.source.endpointName   = conn.getSourceEndpointName();
        c.source.endpointIndex  = conn.getSourceEndpointIndex();
        c.dest.endpointName     = conn.getDestEndpointName();
        c.dest.endpointIndex    = conn.getDestEndpointIndex();
        c.interpolationType     = conn.interpolationType;
        c.delayLength           = getDelayLength (conn.delayLength);
    }